

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void DumpFunction(Proto *f,TString *psource,DumpState *D)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  TValue *pTVar4;
  ushort uVar5;
  int x;
  TString *pTVar6;
  char *__assertion;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if (D->strip == 0) {
    pTVar6 = (TString *)0x0;
    if (f->source != psource) {
      pTVar6 = f->source;
    }
  }
  else {
    pTVar6 = (TString *)0x0;
  }
  DumpString(pTVar6,D);
  DumpInt(f->linedefined,D);
  DumpInt(f->lastlinedefined,D);
  DumpByte((uint)f->numparams,D);
  DumpByte((uint)f->is_vararg,D);
  DumpByte((uint)f->maxstacksize,D);
  DumpInt(f->sizecode,D);
  DumpBlock(f->code,(long)f->sizecode << 2,D);
  uVar3 = f->sizek;
  DumpInt(uVar3,D);
  for (lVar7 = 0; (ulong)(~((int)uVar3 >> 0x1f) & uVar3) << 4 != lVar7; lVar7 = lVar7 + 0x10) {
    pTVar4 = f->k;
    DumpByte(*(ushort *)((long)&pTVar4->tt_ + lVar7) & 0x7f,D);
    uVar2 = *(ushort *)((long)&pTVar4->tt_ + lVar7);
    uVar5 = uVar2 & 0x7f;
    switch(uVar5) {
    case 0:
      break;
    case 1:
      if (uVar2 != 1) {
        __assertion = "((((o))->tt_) == (1))";
        uVar3 = 0x74;
        goto LAB_00114500;
      }
      DumpByte(*(int *)((long)&pTVar4->value_ + lVar7),D);
      break;
    case 2:
switchD_001141cb_caseD_2:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                    ,0x81,"void DumpConstants(const Proto *, DumpState *)");
    case 3:
      if (uVar2 != 3) {
        __assertion = "((((o))->tt_) == (((3) | ((0) << 4))))";
        uVar3 = 0x77;
        goto LAB_00114500;
      }
      DumpNumber(*(lua_Number *)((long)&pTVar4->value_ + lVar7),D);
      break;
    case 4:
switchD_001141cb_caseD_4:
      if ((uVar2 & 0xf) == 4) {
        pTVar6 = *(TString **)((long)&pTVar4->value_ + lVar7);
        if ((pTVar6->tt & 0xf) == 4) {
          DumpString(pTVar6,D);
          break;
        }
        __assertion = "(((((o)->value_).gc)->tt) & 0x0F) == 4";
      }
      else {
        __assertion = "(((((((o))->tt_)) & 0x0F)) == (4))";
      }
      uVar3 = 0x7e;
LAB_00114500:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                    ,uVar3,"void DumpConstants(const Proto *, DumpState *)");
    default:
      if (uVar5 != 0x13) {
        if (uVar5 != 0x14) goto switchD_001141cb_caseD_2;
        goto switchD_001141cb_caseD_4;
      }
      if (uVar2 != 0x13) {
        __assertion = "((((o))->tt_) == (((3) | ((1) << 4))))";
        uVar3 = 0x7a;
        goto LAB_00114500;
      }
      DumpInteger(*(lua_Integer *)((long)&pTVar4->value_ + lVar7),D);
    }
  }
  uVar3 = f->sizeupvalues;
  DumpInt(uVar3,D);
  for (lVar7 = 0; (ulong)(~((int)uVar3 >> 0x1f) & uVar3) * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18)
  {
    DumpByte((uint)(&f->upvalues->instack)[lVar7],D);
    DumpByte((uint)(&f->upvalues->idx)[lVar7],D);
  }
  uVar3 = f->sizep;
  DumpInt(uVar3,D);
  for (uVar8 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar8; uVar8 = uVar8 + 1) {
    DumpFunction(f->p[uVar8],f->source,D);
  }
  x = 0;
  if (D->strip == 0) {
    x = f->sizelineinfo;
  }
  DumpInt(x,D);
  DumpBlock(f->lineinfo,(long)x << 2,D);
  uVar3 = f->sizelocvars;
  uVar8 = (ulong)uVar3;
  uVar10 = uVar3;
  if (D->strip != 0) {
    lVar7 = uVar8 * 0x20 + -8;
    do {
      uVar9 = (uint)uVar8;
      uVar10 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar9 < 1) break;
      uVar8 = (ulong)(uVar9 - 1);
      piVar1 = (int *)((long)&f->locvars->varname + lVar7);
      lVar7 = lVar7 + -0x20;
      uVar10 = uVar9;
    } while (*piVar1 == -1);
  }
  DumpInt(uVar10,D);
  for (lVar7 = 0; (ulong)(~((int)uVar10 >> 0x1f) & uVar10) << 5 != lVar7; lVar7 = lVar7 + 0x20) {
    if (D->strip == 0) {
      pTVar6 = *(TString **)((long)&f->locvars->varname + lVar7);
    }
    else {
      pTVar6 = (TString *)0x0;
    }
    DumpString(pTVar6,D);
    DumpInt(*(int *)((long)&f->locvars->startpc + lVar7),D);
    DumpInt(*(int *)((long)&f->locvars->endpc + lVar7),D);
    DumpInt(*(int *)((long)&f->locvars->ravi_type_map + lVar7),D);
    DumpString(*(TString **)((long)&f->locvars->usertype + lVar7),D);
  }
  uVar3 = f->sizeupvalues;
  uVar8 = (ulong)uVar3;
  uVar10 = uVar3;
  if (D->strip != 0) {
    lVar7 = uVar8 * 0x18 + -8;
    do {
      uVar9 = (uint)uVar8;
      uVar10 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar9 < 1) break;
      uVar8 = (ulong)(uVar9 - 1);
      piVar1 = (int *)((long)&f->upvalues->name + lVar7);
      lVar7 = lVar7 + -0x18;
      uVar10 = uVar9;
    } while (*piVar1 == -1);
  }
  DumpInt(uVar10,D);
  for (lVar7 = 0; (ulong)(~((int)uVar10 >> 0x1f) & uVar10) * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18
      ) {
    if (D->strip == 0) {
      pTVar6 = *(TString **)((long)&f->upvalues->name + lVar7);
    }
    else {
      pTVar6 = (TString *)0x0;
    }
    DumpString(pTVar6,D);
    DumpInt(*(int *)((long)&f->upvalues->ravi_type_map + lVar7),D);
    DumpString(*(TString **)((long)&f->upvalues->usertype + lVar7),D);
  }
  return;
}

Assistant:

static void DumpFunction (const Proto *f, TString *psource, DumpState *D) {
  if (D->strip || f->source == psource)
    DumpString(NULL, D);  /* no debug info or same source as its parent */
  else
    DumpString(f->source, D);
  DumpInt(f->linedefined, D);
  DumpInt(f->lastlinedefined, D);
  DumpByte(f->numparams, D);
  DumpByte(f->is_vararg, D);
  DumpByte(f->maxstacksize, D);
  DumpCode(f, D);
  DumpConstants(f, D);
  DumpUpvalues(f, D);
  DumpProtos(f, D);
  DumpDebug(f, D);
}